

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FIBoolDecoder::decode(FIBoolDecoder *this,uint8_t *data,size_t len)

{
  DeadlyImportError *this_00;
  long in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_Assimp::FIValue> sVar1;
  undefined1 local_98 [24];
  size_t i;
  size_type sStack_78;
  uint8_t mask;
  size_t numBools;
  size_t unusedBits;
  undefined1 local_60 [7];
  uint8_t b;
  vector<bool,_std::allocator<bool>_> value;
  size_t len_local;
  uint8_t *data_local;
  FIBoolDecoder *this_local;
  
  if (in_RCX == 0) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)local_60);
  len_local = len + 1;
  unusedBits._7_1_ = *(byte *)len;
  numBools = (size_t)(unusedBits._7_1_ >> 4);
  sStack_78 = (in_RCX * 8 - numBools) - 4;
  std::vector<bool,_std::allocator<bool>_>::reserve
            ((vector<bool,_std::allocator<bool>_> *)local_60,sStack_78);
  i._7_1_ = 8;
  for (local_98._16_8_ = 0; (ulong)local_98._16_8_ < sStack_78;
      local_98._16_8_ = local_98._16_8_ + 1) {
    if (i._7_1_ == 0) {
      i._7_1_ = 0x80;
      unusedBits._7_1_ = *(byte *)len_local;
      len_local = len_local + 1;
    }
    std::vector<bool,_std::allocator<bool>_>::push_back
              ((vector<bool,_std::allocator<bool>_> *)local_60,(unusedBits._7_1_ & i._7_1_) != 0);
  }
  FIBoolValue::create((FIBoolValue *)local_98,(vector<bool,_std::allocator<bool>_> *)local_60);
  std::shared_ptr<Assimp::FIValue_const>::shared_ptr<Assimp::FIBoolValue,void>
            ((shared_ptr<Assimp::FIValue_const> *)this,(shared_ptr<Assimp::FIBoolValue> *)local_98);
  std::shared_ptr<Assimp::FIBoolValue>::~shared_ptr((shared_ptr<Assimp::FIBoolValue> *)local_98);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_60)
  ;
  sVar1.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar1.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        if (len < 1) {
            throw DeadlyImportError(parseErrorMessage);
        }
        std::vector<bool> value;
        uint8_t b = *data++;
        size_t unusedBits = b >> 4;
        size_t numBools = (len * 8) - 4 - unusedBits;
        value.reserve(numBools);
        uint8_t mask = 1 << 3;
        for (size_t i = 0; i < numBools; ++i) {
            if (!mask) {
                mask = 1 << 7;
                b = *data++;
            }
            value.push_back((b & mask) != 0);
        }
        return FIBoolValue::create(std::move(value));
    }